

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::kotlin::FieldGenerator::GenerateEnumField
          (FieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  ClassNameResolver *this_00;
  EnumDescriptor *descriptor;
  long lVar3;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  string_view text;
  string_view text_00;
  allocator<char> local_3a2;
  allocator<char> local_3a1;
  JvmNameContext name_ctx;
  undefined1 *local_388;
  undefined8 local_380;
  undefined1 local_378 [8];
  undefined8 uStack_370;
  char *local_368;
  size_type local_360;
  char local_358 [8];
  undefined8 uStack_350;
  undefined1 *local_348;
  undefined8 local_340;
  undefined1 local_338 [8];
  undefined8 uStack_330;
  char *local_328;
  size_type local_320;
  char local_318 [8];
  undefined8 uStack_310;
  _Any_data local_308;
  code *local_2f8;
  code *local_2f0;
  string local_2e8;
  string local_2c8;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  cleanup;
  undefined1 local_290 [64];
  __index_type local_250;
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  bool local_228;
  bool local_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8 [8];
  undefined8 uStack_1c0;
  variant<std::__cxx11::string,std::function<bool()>> local_1b8 [32];
  char local_198;
  undefined1 *local_190;
  undefined8 local_188;
  undefined1 local_180 [16];
  undefined1 local_170;
  undefined1 local_128;
  Options local_120;
  Options local_d0;
  Options local_80;
  
  this_00 = java::Context::GetNameResolver(this->context_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"kt_type",(allocator<char> *)&name_ctx);
  descriptor = FieldDescriptor::enum_type(this->descriptor_);
  java::ClassNameResolver::GetImmutableClassName<google::protobuf::EnumDescriptor>
            (&local_2e8,this_00,descriptor);
  java::EscapeKotlinKeywords((string *)&local_308,&local_2e8);
  io::Printer::Sub::Sub<std::__cxx11::string>
            ((Sub *)local_290,&local_2c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308);
  vars.len_ = 1;
  vars.ptr_ = (pointer)local_290;
  io::Printer::WithVars(&cleanup,printer,vars);
  io::Printer::Sub::~Sub((Sub *)local_290);
  std::__cxx11::string::~string((string *)local_308._M_pod_data);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  bVar2 = FieldDescriptor::is_repeated(this->descriptor_);
  if (bVar2) {
    GenerateRepeatedEnumField(this,printer);
  }
  else {
    name_ctx.options = &this->context_->options_;
    name_ctx.lite = this->lite_;
    pFVar1 = this->descriptor_;
    name_ctx.printer = printer;
    java::Options::Options(&local_80,name_ctx.options);
    java::WriteFieldDocComment(printer,pFVar1,&local_80,true);
    java::Options::~Options(&local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"jvm_name_get",&local_3a1);
    local_290._8_8_ = local_320;
    local_290._0_8_ = local_290 + 0x10;
    if (local_328 == local_318) {
      local_290._24_8_ = uStack_310;
    }
    else {
      local_290._0_8_ = local_328;
    }
    local_320 = 0;
    local_318[0] = '\0';
    local_308._8_8_ = 0;
    local_308._M_unused._M_object = &name_ctx;
    local_2f0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_2f8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_328 = local_318;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_290 + 0x20),
               (function<bool_()> *)&local_308);
    std::_Function_base::~_Function_base((_Function_base *)&local_308);
    local_248._M_p = (pointer)&local_238;
    local_240 = 0;
    local_238._M_local_buf[0] = '\0';
    local_228 = false;
    if (local_250 == '\x01') {
      std::__cxx11::string::assign((char *)&local_248);
    }
    local_1e0 = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"jvm_name_set",&local_3a2);
    local_1d0 = local_340;
    local_1d8 = local_1c8;
    if (local_348 == local_338) {
      uStack_1c0 = uStack_330;
    }
    else {
      local_1d8 = local_348;
    }
    local_340 = 0;
    local_338[0] = 0;
    local_308._8_8_ = 0;
    local_308._M_unused._M_object = &name_ctx;
    local_2f0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_2f8 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    local_348 = local_338;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_1b8,(function<bool_()> *)&local_308);
    std::_Function_base::~_Function_base((_Function_base *)&local_308);
    local_190 = local_180;
    local_188 = 0;
    local_180[0] = 0;
    local_170 = 0;
    if (local_198 == '\x01') {
      std::__cxx11::string::assign((char *)&local_190);
    }
    local_128 = 0;
    io::Printer::Emit(printer,local_290,2,0xc5);
    lVar3 = 0xb8;
    do {
      io::Printer::Sub::~Sub((Sub *)(local_290 + lVar3));
      lVar3 = lVar3 + -0xb8;
    } while (lVar3 != -0xb8);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_328);
    bVar2 = java::SupportUnknownEnumValue(this->descriptor_);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_368,"jvm_name_get",&local_3a1);
      local_290._8_8_ = local_360;
      if (local_368 == local_358) {
        local_290._24_8_ = uStack_350;
        local_290._0_8_ = local_290 + 0x10;
      }
      else {
        local_290._0_8_ = local_368;
      }
      local_360 = 0;
      local_358[0] = '\0';
      local_308._8_8_ = 0;
      local_308._M_unused._M_object = &name_ctx;
      local_2f0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_2f8 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_368 = local_358;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                ((variant<std::__cxx11::string,std::function<bool()>> *)(local_290 + 0x20),
                 (function<bool_()> *)&local_308);
      std::_Function_base::~_Function_base((_Function_base *)&local_308);
      local_248._M_p = (pointer)&local_238;
      local_240 = 0;
      local_238._M_local_buf[0] = '\0';
      local_228 = false;
      if (local_250 == '\x01') {
        std::__cxx11::string::assign((char *)&local_248);
      }
      local_1e0 = false;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_388,"jvm_name_set",&local_3a2);
      local_1d0 = local_380;
      local_1d8 = local_1c8;
      if (local_388 == local_378) {
        uStack_1c0 = uStack_370;
      }
      else {
        local_1d8 = local_388;
      }
      local_380 = 0;
      local_378[0] = 0;
      local_308._8_8_ = 0;
      local_308._M_unused._M_object = &name_ctx;
      local_2f0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_2f8 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_388 = local_378;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_1b8,(function<bool_()> *)&local_308);
      std::_Function_base::~_Function_base((_Function_base *)&local_308);
      local_190 = local_180;
      local_188 = 0;
      local_180[0] = 0;
      local_170 = 0;
      if (local_198 == '\x01') {
        std::__cxx11::string::assign((char *)&local_190);
      }
      local_128 = 0;
      io::Printer::Emit(printer,local_290,2,0xdd);
      lVar3 = 0xb8;
      do {
        io::Printer::Sub::~Sub((Sub *)(local_290 + lVar3));
        lVar3 = lVar3 + -0xb8;
      } while (lVar3 != -0xb8);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_368);
    }
    pFVar1 = this->descriptor_;
    java::Options::Options(&local_d0,&this->context_->options_);
    java::WriteFieldAccessorDocComment(printer,pFVar1,CLEARER,&local_d0,false,true,false);
    java::Options::~Options(&local_d0);
    text._M_str = 
    "public fun ${$clear$kt_capitalized_name$$}$() {\n  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n}\n"
    ;
    text._M_len = 0x65;
    io::Printer::Print<>(printer,text);
    bVar2 = FieldDescriptor::has_presence(this->descriptor_);
    if (bVar2) {
      pFVar1 = this->descriptor_;
      java::Options::Options(&local_120,&this->context_->options_);
      java::WriteFieldAccessorDocComment(printer,pFVar1,HAZZER,&local_120,false,true,false);
      java::Options::~Options(&local_120);
      text_00._M_str =
           "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n}\n"
      ;
      text_00._M_len = 0x78;
      io::Printer::Print<>(printer,text_00);
    }
  }
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&cleanup);
  return;
}

Assistant:

void FieldGenerator::GenerateEnumField(io::Printer* printer) const {
  auto name_resolver = context_->GetNameResolver();
  auto cleanup = printer->WithVars(
      {{"kt_type",
        java::EscapeKotlinKeywords(
            name_resolver->GetImmutableClassName(descriptor_->enum_type()))}});

  if (descriptor_->is_repeated()) {
    GenerateRepeatedEnumField(printer);
    return;
  }

  java::JvmNameContext name_ctx = {context_->options(), printer, lite_};
  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name_get",
           [&] { JvmName("${$get$kt_capitalized_name$$}$", name_ctx); }},
          {"jvm_name_set",
           [&] { JvmName("${$set$kt_capitalized_name$$}$", name_ctx); }},
      },
      "$kt_deprecation$public var $kt_name$: $kt_type$\n"
      "  $jvm_name_get$"
      "  get() = $kt_dsl_builder$.${$$kt_safe_name$$}$\n"
      "  $jvm_name_set$"
      "  set(value) {\n"
      "    $kt_dsl_builder$.${$$kt_safe_name$$}$ = value\n"
      "  }\n");

  if (java::SupportUnknownEnumValue(descriptor_)) {
    printer->Emit(
        {
            {"jvm_name_get",
             [&] { JvmName("${$get$kt_capitalized_name$Value$}$", name_ctx); }},
            {"jvm_name_set",
             [&] { JvmName("${$set$kt_capitalized_name$Value$}$", name_ctx); }},
        },
        "$kt_deprecation$public var $kt_name$Value: kotlin.Int\n"
        "  $jvm_name_get$"
        "  get() = $kt_dsl_builder$.${$$kt_property_name$Value$}$\n"
        "  $jvm_name_set$"
        "  set(value) {\n"
        "    $kt_dsl_builder$.${$$kt_property_name$Value$}$ = value\n"
        "  }\n");
  }

  WriteFieldAccessorDocComment(printer, descriptor_, java::CLEARER,
                               context_->options(),
                               /* builder */ false, /* kdoc */ true);
  printer->Print(
      "public fun ${$clear$kt_capitalized_name$$}$() {\n"
      "  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
      "}\n");

  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, java::HAZZER,
                                 context_->options(),
                                 /* builder */ false, /* kdoc */ true);
    printer->Print(
        "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n"
        "  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n"
        "}\n");
  }
}